

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZTensor.h
# Opt level: O2

TFad<6,_double> * __thiscall
TPZTensor<TFad<6,_double>_>::J2
          (TFad<6,_double> *__return_storage_ptr__,TPZTensor<TFad<6,_double>_> *this)

{
  TFad<6,_double> *rhs;
  TFad<6,_double> *local_130;
  TPZVec<TFad<6,_double>_> s;
  TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_> local_108;
  TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_> local_f8;
  TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_> local_e8;
  TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_> local_d8;
  TFad<6,_double> *local_c8;
  TFad<6,_double> *local_c0;
  TFad<6,_double> **local_b8;
  TFad<6,_double> *local_b0;
  TFadExpr<TFadBinaryMinus<TFadExpr<TFadBinaryMul<TFadExpr<TFadUnaryMin<TFad<6,_double>_>_>,_TFad<6,_double>_>_>,_TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>_>_>
  local_a8;
  TFadExpr<TFadBinaryMinus<TFadExpr<TFadBinaryMinus<TFadExpr<TFadBinaryMul<TFadExpr<TFadUnaryMin<TFad<6,_double>_>_>,_TFad<6,_double>_>_>,_TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>_>_>,_TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>_>_>
  local_98;
  TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryMinus<TFadExpr<TFadBinaryMinus<TFadExpr<TFadBinaryMul<TFadExpr<TFadUnaryMin<TFad<6,_double>_>_>,_TFad<6,_double>_>_>,_TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>_>_>,_TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>_>_>,_TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>_>_>
  local_88;
  TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryMinus<TFadExpr<TFadBinaryMinus<TFadExpr<TFadBinaryMul<TFadExpr<TFadUnaryMin<TFad<6,_double>_>_>,_TFad<6,_double>_>_>,_TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>_>_>,_TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>_>_>,_TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>_>_>,_TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>_>_>
  local_78;
  TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryMinus<TFadExpr<TFadBinaryMinus<TFadExpr<TFadBinaryMul<TFadExpr<TFadUnaryMin<TFad<6,_double>_>_>,_TFad<6,_double>_>_>,_TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>_>_>,_TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>_>_>,_TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>_>_>,_TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>_>_>,_TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>_>_>
  local_68;
  TFad<6,_double> local_58;
  
  TPZVec<TFad<6,_double>_>::TPZVec(&s,3);
  TPZTensor<TFad<6,double>>::DeviatoricDiagonal_T<TFad<6,double>>
            ((TPZTensor<TFad<6,double>> *)this,&s);
  local_b8 = &local_130;
  local_130 = s.fStore;
  local_d8.fadexpr_.left_ = s.fStore + 1;
  local_a8.fadexpr_.left_ =
       (TFadExpr<TFadBinaryMul<TFadExpr<TFadUnaryMin<TFad<6,_double>_>_>,_TFad<6,_double>_>_> *)
       &local_b8;
  local_a8.fadexpr_.right_ =
       (TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_> *)&local_c8;
  local_c8 = s.fStore;
  local_d8.fadexpr_.right_ = s.fStore + 2;
  local_98.fadexpr_.left_ = &local_a8;
  local_98.fadexpr_.right_ = &local_d8;
  local_88.fadexpr_.left_ = &local_98;
  local_108.fadexpr_.left_ = (this->fData).super_TPZVec<TFad<6,_double>_>.fStore;
  local_e8.fadexpr_.left_ = local_108.fadexpr_.left_ + 1;
  local_88.fadexpr_.right_ = &local_e8;
  local_78.fadexpr_.left_ = &local_88;
  local_f8.fadexpr_.left_ = local_108.fadexpr_.left_ + 2;
  local_78.fadexpr_.right_ = &local_f8;
  local_68.fadexpr_.left_ = &local_78;
  local_108.fadexpr_.left_ = local_108.fadexpr_.left_ + 4;
  local_68.fadexpr_.right_ = &local_108;
  local_108.fadexpr_.right_ = local_108.fadexpr_.left_;
  local_f8.fadexpr_.right_ = local_f8.fadexpr_.left_;
  local_e8.fadexpr_.right_ = local_e8.fadexpr_.left_;
  local_c0 = local_d8.fadexpr_.right_;
  local_b0 = local_d8.fadexpr_.left_;
  TFad<6,double>::
  TFad<TFadBinaryAdd<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryMinus<TFadExpr<TFadBinaryMinus<TFadExpr<TFadBinaryMul<TFadExpr<TFadUnaryMin<TFad<6,double>>>,TFad<6,double>>>,TFadExpr<TFadBinaryMul<TFad<6,double>,TFad<6,double>>>>>,TFadExpr<TFadBinaryMul<TFad<6,double>,TFad<6,double>>>>>,TFadExpr<TFadBinaryMul<TFad<6,double>,TFad<6,double>>>>>,TFadExpr<TFadBinaryMul<TFad<6,double>,TFad<6,double>>>>>,TFadExpr<TFadBinaryMul<TFad<6,double>,TFad<6,double>>>>>
            ((TFad<6,double> *)&local_58,&local_68);
  rhs = TPZAssert::NonNegative<TFad<6,double>>(&local_58);
  TFad<6,_double>::TFad(__return_storage_ptr__,rhs);
  TPZVec<TFad<6,_double>_>::~TPZVec(&s);
  return __return_storage_ptr__;
}

Assistant:

T TPZTensor<T>::J2() const {
    TPZVec<T> s(3);
    DeviatoricDiagonal_T<T>(s);
    T value = -s[0] * s[1] - s[0] * s[2] - s[1] * s[2] + fData[_XY_] * fData[_XY_] + fData[_XZ_] * fData[_XZ_] + fData[_YZ_] * fData[_YZ_];
    return TPZAssert::NonNegative(value);
}